

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpsvc(char *card,char *value,char *comm,int *status)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char strbuf [21];
  size_t valpos;
  size_t nblank;
  size_t cardlen;
  size_t ii;
  int jj;
  int local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  char local_68 [20];
  undefined1 local_54;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  int local_2c;
  int *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  if (0 < *in_RCX) {
    return *in_RCX;
  }
  *in_RSI = '\0';
  if (in_RDX != (char *)0x0) {
    *in_RDX = '\0';
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = strlen(in_RDI);
  if (0x50 < local_40) {
    strncpy(local_68,local_10,0x14);
    local_54 = 0;
    ffpmsg((char *)0x16a8ed);
    ffpmsg((char *)0x16a8f7);
    *local_28 = 0xcf;
    return 0xcf;
  }
  if (*local_10 < 'H') {
    local_6c = -1;
  }
  else {
    if (*local_10 < 'I') {
      local_70 = strncmp(local_10,"HIERARCH ",9);
    }
    else {
      local_70 = 1;
    }
    local_6c = local_70;
  }
  if (local_6c == 0) {
    local_50 = strcspn(local_10,"=");
    if (local_50 == local_40) {
      if ((local_20 != (char *)0x0) && (8 < local_40)) {
        strcpy(local_20,local_10 + 8);
        for (local_2c = (int)local_40 + -9; (-1 < local_2c && (local_20[local_2c] == ' '));
            local_2c = local_2c + -1) {
          local_20[local_2c] = '\0';
        }
      }
      return *local_28;
    }
    local_50 = local_50 + 1;
LAB_0016af0d:
    local_48 = strspn(local_10 + local_50," ");
    if (local_48 + local_50 == local_40) {
      local_4 = *local_28;
    }
    else {
      local_38 = local_50 + local_48;
      if (local_10[local_38] == '/') {
        local_38 = local_38 + 1;
      }
      else if (local_10[local_38] == '\'') {
        *local_18 = local_10[local_38];
        uVar2 = local_38;
        for (local_2c = 1; local_38 = uVar2 + 1, local_38 < local_40 && local_2c < 0x46;
            local_2c = local_2c + 1) {
          if (local_10[local_38] == '\'') {
            if (local_10[uVar2 + 2] != '\'') {
              local_18[local_2c] = local_10[local_38];
              break;
            }
            local_18[local_2c] = local_10[local_38];
            local_38 = uVar2 + 2;
            local_2c = local_2c + 1;
          }
          if (local_2c < 0x46) {
            local_18[local_2c] = local_10[local_38];
          }
          uVar2 = local_38;
        }
        if ((local_38 == local_40) || (0x45 < local_2c)) {
          if (local_2c < 0x45) {
            local_a8 = local_2c;
          }
          else {
            local_a8 = 0x45;
          }
          local_2c = local_a8;
          local_18[local_a8] = '\'';
          local_18[local_a8 + 1] = '\0';
          ffpmsg((char *)0x16b1a9);
          ffpmsg((char *)0x16b1b6);
        }
        else {
          local_18[local_2c + 1] = '\0';
          local_38 = uVar2 + 2;
        }
      }
      else if (local_10[local_38] == '(') {
        sVar3 = strcspn(local_10 + local_38,")");
        local_48 = sVar3;
        sVar1 = strlen(local_10 + local_38);
        if ((sVar3 == sVar1) || (0x45 < local_48)) {
          ffpmsg((char *)0x16b268);
          ffpmsg((char *)0x16b275);
          *local_28 = 0xcd;
          return 0xcd;
        }
        local_48 = local_48 + 1;
        strncpy(local_18,local_10 + local_38,local_48);
        local_18[local_48] = '\0';
        local_38 = local_38 + local_48;
      }
      else {
        local_48 = strcspn(local_10 + local_38," /");
        if (0x46 < local_48) {
          local_48 = 0x46;
        }
        strncpy(local_18,local_10 + local_38,local_48);
        local_18[local_48] = '\0';
        local_38 = local_38 + local_48;
      }
      if (local_20 != (char *)0x0) {
        local_48 = strspn(local_10 + local_38," ");
        uVar2 = local_38 + local_48;
        if (uVar2 < 0x50) {
          local_38 = uVar2;
          if ((local_10[uVar2] == '/') && (local_38 = uVar2 + 1, local_10[local_38] == ' ')) {
            local_38 = uVar2 + 2;
          }
          strncpy(local_20,local_10 + local_38,0x48);
          local_20[0x48] = '\0';
          sVar3 = strlen(local_20);
          local_2c = (int)sVar3;
          while ((local_2c = local_2c + -1, -1 < local_2c && (local_20[local_2c] == ' '))) {
            local_20[local_2c] = '\0';
          }
        }
      }
      local_4 = *local_28;
    }
  }
  else {
    if (8 < local_40) {
      if (*local_10 < 'C') {
        local_74 = -1;
      }
      else {
        if (*local_10 < 'D') {
          local_78 = strncmp(local_10,"COMMENT ",8);
        }
        else {
          local_78 = 1;
        }
        local_74 = local_78;
      }
      if (local_74 != 0) {
        if (*local_10 < 'H') {
          local_7c = -1;
        }
        else {
          if (*local_10 < 'I') {
            local_80 = strncmp(local_10,"HISTORY ",8);
          }
          else {
            local_80 = 1;
          }
          local_7c = local_80;
        }
        if (local_7c != 0) {
          if (*local_10 < 'E') {
            local_84 = -1;
          }
          else {
            if (*local_10 < 'F') {
              local_88 = strncmp(local_10,"END     ",8);
            }
            else {
              local_88 = 1;
            }
            local_84 = local_88;
          }
          if (local_84 != 0) {
            if (*local_10 < 'C') {
              local_8c = -1;
            }
            else {
              if (*local_10 < 'D') {
                local_90 = strncmp(local_10,"CONTINUE",8);
              }
              else {
                local_90 = 1;
              }
              local_8c = local_90;
            }
            if (local_8c != 0) {
              if (*local_10 < ' ') {
                local_94 = -1;
              }
              else {
                if (*local_10 < '!') {
                  local_98 = strncmp(local_10,"        ",8);
                }
                else {
                  local_98 = 1;
                }
                local_94 = local_98;
              }
              if (local_94 != 0) {
                if (local_10[8] < '=') {
                  local_9c = -1;
                }
                else {
                  if (local_10[8] < '>') {
                    local_a0 = strncmp(local_10 + 8,"= ",2);
                  }
                  else {
                    local_a0 = 1;
                  }
                  local_9c = local_a0;
                }
                if (local_9c == 0) {
                  local_50 = 10;
                }
                else {
                  local_50 = strcspn(local_10,"=");
                  if (local_50 == local_40) {
                    if ((local_20 != (char *)0x0) && (8 < local_40)) {
                      strcpy(local_20,local_10 + 8);
                      for (local_2c = (int)local_40 + -9;
                          (-1 < local_2c && (local_20[local_2c] == ' ')); local_2c = local_2c + -1)
                      {
                        local_20[local_2c] = '\0';
                      }
                    }
                    return *local_28;
                  }
                  local_50 = local_50 + 1;
                }
                goto LAB_0016af0d;
              }
            }
          }
        }
      }
    }
    if ((local_20 != (char *)0x0) && (8 < local_40)) {
      strcpy(local_20,local_10 + 8);
      for (local_2c = (int)local_40 + -9; (-1 < local_2c && (local_20[local_2c] == ' '));
          local_2c = local_2c + -1) {
        local_20[local_2c] = '\0';
      }
    }
    local_4 = *local_28;
  }
  return local_4;
}

Assistant:

int ffpsvc(char *card,    /* I - FITS header card (nominally 80 bytes long) */
           char *value,   /* O - value string parsed from the card */
           char *comm,    /* O - comment string parsed from the card */
           int *status)   /* IO - error status   */
/*
  ParSe the Value and Comment strings from the input header card string.
  If the card contains a quoted string value, the returned value string
  includes the enclosing quote characters.  If comm = NULL, don't return
  the comment string.
*/
{
    int jj;
    size_t ii, cardlen, nblank, valpos;
    char strbuf[21];

    if (*status > 0)
        return(*status);

    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    cardlen = strlen(card);
    if (cardlen >= FLEN_CARD)
    {
       strncpy(strbuf,card,20);
       strbuf[20]='\0';
       ffpmsg("The card string starting with the chars below is too long:");
       ffpmsg(strbuf); 
       return(*status = BAD_KEYCHAR);
    }

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }
    else if (cardlen < 9  ||
        FSTRNCMP(card, "COMMENT ", 8) == 0 ||  /* keywords with no value */
        FSTRNCMP(card, "HISTORY ", 8) == 0 ||
        FSTRNCMP(card, "END     ", 8) == 0 ||
        FSTRNCMP(card, "CONTINUE", 8) == 0 ||
        FSTRNCMP(card, "        ", 8) == 0 )
    {
        /*  no value, so the comment extends from cols 9 - 80  */
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
             strcpy(comm, &card[8]);

             jj=cardlen - 8;
             for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
             {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
             }
          }
        }
        return(*status);
    }
    else if (FSTRNCMP(&card[8], "= ", 2) == 0  )
    {
        /* normal keyword with '= ' in cols 9-10 */
        valpos = 10;  /* starting position of the value field */
    }
    else
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }

    nblank = strspn(&card[valpos], " "); /* find number of leading blanks */

    if (nblank + valpos == cardlen)
    {
      /* the absence of a value string is legal, and simply indicates
         that the keyword value is undefined.  Don't write an error
         message in this case.
      */
        return(*status);
    }

    ii = valpos + nblank;

    if (card[ii] == '/' )  /* slash indicates start of the comment */
    {
         ii++;
    }
    else if (card[ii] == '\'' )  /* is this a quoted string value? */
    {
        value[0] = card[ii];
        for (jj=1, ii++; ii < cardlen && jj < FLEN_VALUE-1; ii++, jj++)
        {
            if (card[ii] == '\'')  /*  is this the closing quote?  */
            {
                if (card[ii+1] == '\'')  /* 2 successive quotes? */ 
                {
                   value[jj] = card[ii];
                   ii++;  
                   jj++;
                }
                else
                {
                    value[jj] = card[ii];
                    break;   /* found the closing quote, so exit this loop  */
                }
            }
            if (jj < FLEN_VALUE-1)
               value[jj] = card[ii];  /* copy the next character to the output */
        }

        if (ii == cardlen || jj >= FLEN_VALUE-1)
        {
            jj = minvalue(jj, FLEN_VALUE-2);  /* don't exceed 70 char string length */
            value[jj] = '\'';  /*  close the bad value string  */
            value[jj+1] = '\0';  /*  terminate the bad value string  */
            ffpmsg("This keyword string value has no closing quote:");
            ffpmsg(card);
	    /*  May 2008 - modified to not fail on this minor error  */
/*            return(*status = NO_QUOTE);  */
        }
        else
        {
            value[jj+1] = '\0';  /*  terminate the good value string  */
            ii++;   /*  point to the character following the value  */
        }
    }
    else if (card[ii] == '(' )  /* is this a complex value? */
    {
        nblank = strcspn(&card[ii], ")" ); /* find closing ) */
        if (nblank == strlen( &card[ii] ) || nblank >= FLEN_VALUE-1 )
        {
            ffpmsg("This complex keyword value has no closing ')' within range:");
            ffpmsg(card);
            return(*status = NO_QUOTE);
        }

        nblank++;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;        
    }
    else   /*  an integer, floating point, or logical FITS value string  */
    {
        nblank = strcspn(&card[ii], " /");  /* find the end of the token */
        if (nblank >= FLEN_VALUE) /* This should not happen for correct input */
           nblank = FLEN_VALUE-1;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;
    }

    /*  now find the comment string, if any  */
    if (comm)
    {
      nblank = strspn(&card[ii], " ");  /*  find next non-space character  */
      ii = ii + nblank;

      if (ii < 80)
      {
        if (card[ii] == '/')   /*  ignore the slash separator  */
        {
            ii++;
            if (card[ii] == ' ')  /*  also ignore the following space  */
                ii++;
        }
        strncpy(comm, &card[ii],FLEN_COMMENT-1);  /*  copy the remaining characters  */
        comm[FLEN_COMMENT-1] = '\0';

        jj=strlen(comm);
        for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
        {
            if (comm[jj] == ' ')
                comm[jj] = '\0';
            else
                break;
        }
      }
    }
    return(*status);
}